

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

QSize __thiscall QSplitter::sizeHint(QSplitter *this)

{
  bool bVar1;
  Orientation OVar2;
  QSplitterPrivate *pQVar3;
  QSplitterPrivate *this_00;
  qsizetype qVar4;
  const_reference ppQVar5;
  int *piVar6;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  int i;
  int l;
  QSplitterPrivate *d;
  QSize s;
  int t;
  QSize *in_stack_ffffffffffffffa8;
  int w_00;
  QWidget *this_01;
  int local_38;
  int local_20;
  undefined1 *local_1c;
  int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QSplitter *)0x69d42a);
  QWidget::ensurePolished(in_RDI);
  local_14 = 0;
  local_38 = 0;
  while( true ) {
    this_00 = (QSplitterPrivate *)(long)local_38;
    qVar4 = QList<QSplitterLayoutStruct_*>::size(&pQVar3->list);
    if (qVar4 <= (long)this_00) break;
    ppQVar5 = QList<QSplitterLayoutStruct_*>::at
                        ((QList<QSplitterLayoutStruct_*> *)this_00,
                         (qsizetype)in_stack_ffffffffffffffa8);
    this_01 = (*ppQVar5)->widget;
    bVar1 = QWidget::isHidden((QWidget *)0x69d4a9);
    if (!bVar1) {
      local_1c = &DAT_aaaaaaaaaaaaaaaa;
      local_1c = (undefined1 *)(**(code **)(*(long *)this_01 + 0x70))();
      bVar1 = QSize::isValid((QSize *)this_01);
      if (bVar1) {
        QSplitterPrivate::pick(this_00,in_stack_ffffffffffffffa8);
        local_20 = QSplitterPrivate::trans(this_00,in_stack_ffffffffffffffa8);
        piVar6 = qMax<int>(&local_14,&local_20);
        local_14 = *piVar6;
      }
    }
    local_38 = local_38 + 1;
  }
  OVar2 = orientation((QSplitter *)this_00);
  w_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (OVar2 == Horizontal) {
    QSize::QSize((QSize *)this_00,w_00,(int)in_stack_ffffffffffffffa8);
  }
  else {
    QSize::QSize((QSize *)this_00,w_00,(int)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QSplitter::sizeHint() const
{
    Q_D(const QSplitter);
    ensurePolished();
    int l = 0;
    int t = 0;
    for (int i = 0; i < d->list.size(); ++i) {
        QWidget *w = d->list.at(i)->widget;
        if (w->isHidden())
            continue;
        QSize s = w->sizeHint();
        if (s.isValid()) {
            l += d->pick(s);
            t = qMax(t, d->trans(s));
        }
    }
    return orientation() == Qt::Horizontal ? QSize(l, t) : QSize(t, l);
}